

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O1

void __thiscall Kernel::KBO::KBO(KBO *this,Problem *prb,Options *opts,bool qkbo)

{
  State *pSVar1;
  code *handle;
  
  PrecedenceOrdering::PrecedenceOrdering(&this->super_PrecedenceOrdering,prb,opts,qkbo);
  (this->super_PrecedenceOrdering).super_Ordering._vptr_Ordering = (_func_int **)&PTR__KBO_00b68128;
  weightsFromOpts<Kernel::FuncSigTraits>
            (&this->_funcWeights,this,opts,&(this->super_PrecedenceOrdering)._functionPrecedences);
  pSVar1 = (State *)::operator_new(0x40);
  (pSVar1->_varDiffs)._timestamp = 1;
  (pSVar1->_varDiffs)._size = 0;
  (pSVar1->_varDiffs)._deleted = 0;
  (pSVar1->_varDiffs)._capacityIndex = 0;
  (pSVar1->_varDiffs)._capacity = 0;
  *(undefined8 *)&(pSVar1->_varDiffs)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(pSVar1->_varDiffs)._entries + 4) = 0;
  *(undefined4 *)((long)&(pSVar1->_varDiffs)._afterLast + 4) = 0;
  (this->_state)._M_t.
  super___uniq_ptr_impl<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_>._M_t.
  super__Tuple_impl<0UL,_Kernel::KBO::State_*,_std::default_delete<Kernel::KBO::State>_>.
  super__Head_base<0UL,_Kernel::KBO::State_*,_false>._M_head_impl = pSVar1;
  if ((opts->_kboMaxZero).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01') {
    zeroWeightForMaximalFunc(this);
  }
  handle = warnError;
  if ((opts->_kboAdmissabilityCheck).super_OptionValue<Shell::Options::KboAdmissibilityCheck>.
      actualValue == ERROR) {
    handle = throwError;
  }
  checkAdmissibility<void(*)(Lib::UserErrorException)>(this,handle);
  return;
}

Assistant:

KBO::KBO(Problem& prb, const Options& opts, bool qkbo)
 : PrecedenceOrdering(prb, opts, qkbo)
 , _funcWeights(weightsFromOpts<FuncSigTraits>(opts,_functionPrecedences))
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
 , _predWeights(weightsFromOpts<PredSigTraits>(opts,_predicatePrecedences))
#endif
 , _state(new State())
{
  if (opts.kboMaxZero()) {
    zeroWeightForMaximalFunc();
  }

  if (opts.kboAdmissabilityCheck() == Options::KboAdmissibilityCheck::ERROR)
    checkAdmissibility(throwError);
  else
    checkAdmissibility(warnError);
}